

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_ScattervUnknownSize_Test::TestBody(MxxColl_ScattervUnknownSize_Test *this)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  size_type sVar6;
  char *pcVar7;
  reference actual;
  AssertHelper local_148;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  int j_1;
  Message local_110;
  int local_108;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> result;
  ulong local_80;
  size_t j;
  size_t size;
  int i;
  undefined1 local_60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<int,_std::allocator<int>_> vec;
  comm c;
  MxxColl_ScattervUnknownSize_Test *this_local;
  
  this_00 = &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  mxx::comm::comm((comm *)this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  iVar2 = mxx::comm::rank((comm *)this_00);
  iVar3 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == iVar3 + -1) {
    iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,(long)iVar2);
    for (size._0_4_ = 0;
        iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage),
        (int)size < iVar2; size._0_4_ = (int)size + 1) {
      iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      uVar4 = (ulong)((iVar2 - (int)size) * 5 + -3);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                          (long)(int)size);
      *pvVar5 = uVar4;
      for (local_80 = 0; local_80 < uVar4; local_80 = local_80 + 1) {
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (int)local_80 * -0x924 + (int)size * 0x1bc;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict *)
                   ((long)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_a0);
  iVar2 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  iVar3 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == iVar3 + -1) {
    iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
    mxx::scatterv<int>(&local_b8,
                       (vector<int,_std::allocator<int>_> *)
                       &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,iVar2 + -1,
                       (comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_a0,&local_b8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_b8);
  }
  else {
    iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
    mxx::comm::comm((comm *)&gtest_ar.message_);
    mxx::scatterv_recv<int>(&local_d0,iVar2 + -1,(comm *)&gtest_ar.message_);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_a0,&local_d0);
    std::vector<int,_std::allocator<int>_>::~vector(&local_d0);
    mxx::comm::~comm((comm *)&gtest_ar.message_);
  }
  iVar2 = mxx::comm::size((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  iVar3 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  local_104 = (iVar2 - iVar3) * 5 + -3;
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_a0);
  local_108 = (int)sVar6;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_100,"5*(c.size()-c.rank())-3","(int)result.size()",&local_104,
             &local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&j_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0xe6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&j_1,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_1);
    testing::Message::~Message(&local_110);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    for (gtest_ar_1.message_.ptr_._0_4_ = 0; iVar2 = (int)gtest_ar_1.message_.ptr_,
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_a0), iVar2 < (int)sVar6;
        gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1) {
      iVar2 = (int)gtest_ar_1.message_.ptr_ * -0x924;
      iVar3 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      local_134 = iVar2 + iVar3 * 0x1bc;
      actual = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a0,
                          (long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_130,"-2340*j+444*c.rank()","result[j]",&local_134,actual);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar1) {
        testing::Message::Message(&local_140);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0xe8,pcVar7);
        testing::internal::AssertHelper::operator=(&local_148,&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        testing::Message::~Message(&local_140);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_001646d8;
    }
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
LAB_001646d8:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  mxx::comm::~comm((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxColl, ScattervUnknownSize) {
    mxx::comm c;
    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from last process
    if (c.rank() == c.size()-1) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            size_t size = 5*(c.size()-i)-3;
            sizes[i] = size;
            for (size_t j = 0; j < size; ++j) {
                vec.push_back(-2340*(int)j + 444*i);
            }
        }
    }

    std::vector<int> result;
    if (c.rank() == c.size()-1) {
        result = mxx::scatterv(vec, sizes, c.size()-1, c);
    } else {
        result = mxx::scatterv_recv<int>(c.size()-1);
    }

    ASSERT_EQ(5*(c.size()-c.rank())-3, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(-2340*j+444*c.rank(), result[j]);
    }
}